

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

Matrix<double,_2,_3,_0,_2,_3> *
projects::ipdg_stokes::mesh::computeOutwardNormals
          (Matrix<double,_2,_3,_0,_2,_3> *__return_storage_ptr__,Entity *entity)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_var;
  MatrixXd *pMVar5;
  Index IVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *this;
  VectorwiseOp<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> local_530;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_const_Eigen::Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_Eigen::internal::member_sum<double,_double>,_0>_>,_2,_1>_>
  local_528;
  NegativeReturnType local_4e0;
  NestedExpressionType local_488;
  RowXpr local_480;
  NestedExpressionType local_450;
  NestedExpressionType local_448;
  RowXpr local_440;
  NestedExpressionType local_410;
  NestedExpressionType local_408;
  NestedExpressionType local_400;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_3f8;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>
  local_3e0;
  ConstColwiseReturnType local_3c8;
  SumReturnType local_3b0;
  Matrix<double,1,3,1,1,3> local_388 [8];
  Matrix<double,_1,_3,_1,_1,_3> flip;
  ColXpr local_338;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_300;
  ColXpr local_288;
  ColXpr local_250;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_218;
  ColXpr local_1a0;
  ColXpr local_168;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_130;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_b8;
  undefined1 local_98 [8];
  Matrix<double,_2,_3,_0,_2,_3> test;
  long vert;
  Index local_50;
  Index local_48;
  RefEl local_39;
  undefined1 local_38 [8];
  MatrixXd vertices;
  Geometry *geom;
  Entity *entity_local;
  Matrix<double,_2,_3,_0,_2,_3> *normals;
  long *plVar4;
  
  iVar3 = (*entity->_vptr_Entity[3])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)plVar4;
  iVar3 = (*entity->_vptr_Entity[4])();
  local_39.type_ = (RefElType)iVar3;
  pMVar5 = lf::base::RefEl::NodeCoords(&local_39);
  (**(code **)(*plVar4 + 0x18))
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,plVar4,pMVar5);
  local_48 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  local_50 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  Eigen::Matrix<double,2,3,0,2,3>::Matrix<long,long>
            ((Matrix<double,2,3,0,2,3> *)__return_storage_ptr__,&local_48,&local_50);
  test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5] = 0.0;
  while( true ) {
    dVar1 = test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array
            [5];
    IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
    if (IVar6 + -1 <= (long)dVar1) break;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,1,
                        (long)test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                              m_storage.m_data.array[5] + 1);
    dVar1 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,1,
                        (Index)test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                               m_storage.m_data.array[5]);
    dVar2 = *pSVar7;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                        __return_storage_ptr__,0,
                        (Index)test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                               m_storage.m_data.array[5]);
    *pSVar8 = dVar1 - dVar2;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,0,
                        (Index)test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                               m_storage.m_data.array[5]);
    dVar1 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,0,
                        (long)test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                              m_storage.m_data.array[5] + 1);
    dVar2 = *pSVar7;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                        __return_storage_ptr__,1,
                        (Index)test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                               m_storage.m_data.array[5]);
    *pSVar8 = dVar1 - dVar2;
    test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5] =
         (double)((long)test.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
                        m_data.array[5] + 1);
  }
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,1,0);
  dVar1 = *pSVar7;
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,1,
                      IVar6 + -1);
  dVar2 = *pSVar7;
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                      __return_storage_ptr__,0,IVar6 + -1);
  *pSVar8 = dVar1 - dVar2;
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,0,
                      IVar6 + -1);
  dVar1 = *pSVar7;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_38,0,0);
  dVar2 = *pSVar7;
  IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                      __return_storage_ptr__,1,IVar6 + -1);
  *pSVar8 = dVar1 - dVar2;
  Eigen::Matrix<double,_2,_3,_0,_2,_3>::Matrix((Matrix<double,_2,_3,_0,_2,_3> *)local_98);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_168,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_1a0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
            (&local_130,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&local_168,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             &local_1a0);
  Eigen::DenseBase<Eigen::Matrix<double,2,3,0,2,3>>::operator<<
            (&local_b8,(DenseBase<Eigen::Matrix<double,2,3,0,2,3>> *)local_98,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              *)&local_130);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_250,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_288,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
            (&local_218,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&local_250,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             &local_288);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
                   ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)&local_b8,
                    (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     *)&local_218);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_338,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((ColXpr *)
             (flip.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
            (&local_300,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&local_338,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             (flip.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)this,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              *)&local_300);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::~CommaInitializer(&local_b8);
  local_400 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::array
                        ((MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)__return_storage_ptr__
                        );
  local_408 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::array
                        ((MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)local_98);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>>::operator*
            (&local_3f8,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>> *)&local_400,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_> *)&local_408);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>
  ::matrix(&local_3e0,
           (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>
            *)&local_3f8);
  Eigen::
  DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>_>
  ::colwise(&local_3c8,
            (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>_>
             *)&local_3e0);
  Eigen::
  VectorwiseOp<const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>,_0>
  ::sum(&local_3b0,&local_3c8);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::PartialReduxExpr<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>const>const>const,Eigen::internal::member_sum<double,double>,0>>
            (local_388,
             (EigenBase<Eigen::PartialReduxExpr<const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>,_Eigen::internal::member_sum<double,_double>,_0>_>
              *)&local_3b0);
  local_410 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::array
                        ((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_388);
  local_448 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::array
                        ((MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)__return_storage_ptr__
                        );
  Eigen::DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>::row
            (&local_440,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_> *)&local_448,0)
  ;
  Eigen::ArrayBase<Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>,1,3,false>>::
  operator*=((ArrayBase<Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>,1,3,false>>
              *)&local_440,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_> *)&local_410);
  local_450 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::array
                        ((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_388);
  local_488 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::array
                        ((MatrixBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)__return_storage_ptr__
                        );
  Eigen::DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>::row
            (&local_480,
             (DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_> *)&local_488,1)
  ;
  Eigen::ArrayBase<Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>,1,3,false>>::
  operator*=((ArrayBase<Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,2,3,0,2,3>>,1,3,false>>
              *)&local_480,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_> *)&local_450);
  local_530.m_matrix =
       (ExpressionTypeNested)
       Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::colwise
                 ((DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *)__return_storage_ptr__);
  Eigen::VectorwiseOp<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::normalized(&local_528,&local_530);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_const_Eigen::Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_Eigen::internal::member_sum<double,_double>,_0>_>,_2,_1>_>_>
  ::operator-(&local_4e0,
              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_const_Eigen::Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_Eigen::internal::member_sum<double,_double>,_0>_>,_2,_1>_>_>
               *)&local_528);
  Eigen::Matrix<double,2,3,0,2,3>::operator=
            ((Matrix<double,2,3,0,2,3> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>,_const_Eigen::Replicate<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,_Eigen::internal::member_sum<double,_double>,_0>_>,_2,_1>_>_>_>
              *)&local_4e0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 2, 3> computeOutwardNormals(
    const lf::mesh::Entity &entity) {
  // Get the geometry of the entity
  const auto *const geom = entity.Geometry();
  // Compute the global vertex coordinates
  Eigen::MatrixXd vertices = geom->Global(entity.RefEl().NodeCoords());
  // Use the vertex coordinates to compute the local normals on the edges
  Eigen::Matrix<double, 2, 3> normals(vertices.rows(), vertices.cols());
  for (long vert = 0; vert < vertices.cols() - 1; ++vert) {
    normals(0, vert) = vertices(1, vert + 1) - vertices(1, vert + 0);
    normals(1, vert) = vertices(0, vert + 0) - vertices(0, vert + 1);
  }
  normals(0, vertices.cols() - 1) =
      vertices(1, 0) - vertices(1, vertices.cols() - 1);
  normals(1, vertices.cols() - 1) =
      vertices(0, vertices.cols() - 1) - vertices(0, 0);
  // Compute test vectors to test whether the normal faces inward or outward
  Eigen::Matrix<double, 2, 3> test;
  test << vertices.col(2) - vertices.col(0), vertices.col(0) - vertices.col(1),
      vertices.col(1) - vertices.col(2);
  // Compute the sign to flip the normals
  Eigen::Matrix<double, 1, 3> flip =
      (normals.array() * test.array()).matrix().colwise().sum();
  normals.array().row(0) *= flip.array();
  normals.array().row(1) *= flip.array();
  normals = -normals.colwise().normalized();
  return normals;
}